

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void rw::decompressDXT1(uint8 *adst,int32 w,int32 h,uint8 *src)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  byte *pbVar12;
  ulong uVar13;
  int iVar14;
  uint32 k_1;
  long lVar15;
  ulong uVar16;
  uint local_98 [2];
  uint local_90;
  uint8 local_8c [4];
  uint local_88;
  uint local_84;
  uint local_80;
  undefined4 local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_50;
  byte local_48 [24];
  uint8 idx [16];
  
  if (1 < h * w) {
    uVar13 = 0;
    iVar14 = 0;
    local_50 = 0;
    do {
      uVar1 = *(ushort *)(src + uVar13);
      uVar2 = *(ushort *)(src + uVar13 + 2);
      uVar9 = (uint)(uVar1 >> 0xb) * 0xff;
      local_98[0] = uVar9 / 0x1f;
      uVar4 = (uVar1 >> 5 & 0x3f) * 0xff;
      local_98[1] = uVar4 / 0x3f;
      uVar5 = (uVar1 & 0x1f) * 0xff;
      local_90 = uVar5 / 0x1f;
      local_8c[0] = 0xff;
      local_8c[1] = '\0';
      local_8c[2] = '\0';
      local_8c[3] = '\0';
      uVar6 = (uint)(uVar2 >> 0xb) * 0xff;
      local_88 = uVar6 / 0x1f;
      uVar7 = (uVar2 >> 5 & 0x3f) * 0xff;
      local_84 = uVar7 / 0x3f;
      uVar8 = (uVar2 & 0x1f) * 0xff;
      local_80 = uVar8 / 0x1f;
      local_7c = 0xff;
      if (uVar2 < uVar1) {
        local_78 = (local_88 + local_98[0] * 2) / 3;
        local_74 = (local_84 + local_98[1] * 2) / 3;
        local_70 = (local_80 + local_90 * 2) / 3;
        local_6c = 0xff;
        local_68 = CONCAT44((uVar4 / 0x3f + (uVar7 / 0x3f) * 2) / 3,
                            (uVar9 / 0x1f + (uVar6 / 0x1f) * 2) / 3);
        uStack_60 = CONCAT44(0xff,(uVar5 / 0x1f + (uVar8 / 0x1f) * 2) / 3);
      }
      else {
        local_78 = local_88 + local_98[0] >> 1;
        local_74 = local_84 + local_98[1] >> 1;
        local_70 = local_80 + local_90 >> 1;
        local_6c = 0xff;
        local_68 = 0;
        uStack_60 = 0;
      }
      uVar9 = *(uint *)(src + uVar13 + 4);
      lVar11 = 0;
      do {
        local_48[lVar11] = (byte)uVar9 & 3;
        uVar9 = uVar9 >> 2;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x10);
      iVar10 = w * (int)local_50 + iVar14;
      pbVar12 = local_48;
      lVar11 = 0;
      do {
        lVar15 = 0;
        do {
          uVar3 = (ulong)pbVar12[lVar15];
          uVar16 = (ulong)(uint)(iVar10 + (int)lVar15);
          adst[uVar16 * 4] = (uint8)local_98[uVar3 * 4];
          adst[uVar16 * 4 + 1] = (uint8)local_98[uVar3 * 4 + 1];
          adst[uVar16 * 4 + 2] = local_8c[uVar3 * 0x10 + -4];
          adst[uVar16 * 4 + 3] = local_8c[uVar3 * 0x10];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        lVar11 = lVar11 + 1;
        iVar10 = iVar10 + w;
        pbVar12 = pbVar12 + 4;
      } while (lVar11 != 4);
      iVar14 = iVar14 + 4;
      if (w <= iVar14) {
        iVar14 = 0;
        local_50 = (ulong)((int)local_50 + 4);
      }
      uVar13 = uVar13 + 8;
    } while (uVar13 < (uint)(h * w) >> 1);
  }
  return;
}

Assistant:

void
decompressDXT1(uint8 *adst, int32 w, int32 h, uint8 *src)
{
	/* j loops through old texels
	 * x and y loop through new texels */
	int32 x = 0, y = 0;
	uint32 c[4][4];
	uint8 idx[16];
	uint8 (*dst)[4] = (uint8(*)[4])adst;
	for(int32 j = 0; j < w*h/2; j += 8){
		/* calculate colors */
		uint32 col0 = *((uint16*)&src[j+0]);
		uint32 col1 = *((uint16*)&src[j+2]);
		c[0][0] = ((col0>>11) & 0x1F)*0xFF/0x1F;
		c[0][1] = ((col0>> 5) & 0x3F)*0xFF/0x3F;
		c[0][2] = ( col0      & 0x1F)*0xFF/0x1F;
		c[0][3] = 0xFF;

		c[1][0] = ((col1>>11) & 0x1F)*0xFF/0x1F;
		c[1][1] = ((col1>> 5) & 0x3F)*0xFF/0x3F;
		c[1][2] = ( col1      & 0x1F)*0xFF/0x1F;
		c[1][3] = 0xFF;
		if(col0 > col1){
			c[2][0] = (2*c[0][0] + 1*c[1][0])/3;
			c[2][1] = (2*c[0][1] + 1*c[1][1])/3;
			c[2][2] = (2*c[0][2] + 1*c[1][2])/3;
			c[2][3] = 0xFF;

			c[3][0] = (1*c[0][0] + 2*c[1][0])/3;
			c[3][1] = (1*c[0][1] + 2*c[1][1])/3;
			c[3][2] = (1*c[0][2] + 2*c[1][2])/3;
			c[3][3] = 0xFF;
		}else{
			c[2][0] = (c[0][0] + c[1][0])/2;
			c[2][1] = (c[0][1] + c[1][1])/2;
			c[2][2] = (c[0][2] + c[1][2])/2;
			c[2][3] = 0xFF;

			c[3][0] = 0x00;
			c[3][1] = 0x00;
			c[3][2] = 0x00;
			c[3][3] = 0x00;
		}

		/* make index list */
		uint32 indices = *((uint32*)&src[j+4]);
		for(int32 k = 0; k < 16; k++){
			idx[k] = indices & 0x3;
			indices >>= 2;
		}

		/* write bytes */
		for(uint32 l = 0; l < 4; l++)
			for(uint32 k = 0; k < 4; k++){
				dst[(y+l)*w + x+k][0] = c[idx[l*4+k]][0];
				dst[(y+l)*w + x+k][1] = c[idx[l*4+k]][1];
				dst[(y+l)*w + x+k][2] = c[idx[l*4+k]][2];
				dst[(y+l)*w + x+k][3] = c[idx[l*4+k]][3];
			}
		x += 4;
		if(x >= w){
			y += 4;
			x = 0;
		}
	}
}